

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

stbi_uc * hdr_to_ldr(float *data,int x,int y,int comp)

{
  float fVar1;
  stbi_uc *psVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  float *pfVar11;
  stbi_uc *psVar12;
  float fVar13;
  double dVar14;
  
  uVar5 = x * y;
  psVar2 = (stbi_uc *)malloc((long)(int)(uVar5 * comp));
  if (psVar2 == (stbi_uc *)0x0) {
    free(data);
    failure_reason = "Out of memory";
  }
  else {
    uVar9 = (comp + (comp & 1U)) - 1;
    uVar8 = 0;
    uVar10 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar10 = uVar8;
    }
    lVar3 = (long)comp;
    pfVar11 = data;
    psVar12 = psVar2;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        dVar14 = pow((double)(pfVar11[uVar4] * h2l_scale_i),(double)h2l_gamma_i);
        fVar13 = (float)dVar14 * 255.0 + 0.5;
        fVar1 = 0.0;
        if (0.0 <= fVar13) {
          fVar1 = fVar13;
        }
        fVar13 = 255.0;
        if (fVar1 <= 255.0) {
          fVar13 = fVar1;
        }
        psVar12[uVar4] = (stbi_uc)(int)fVar13;
      }
      if ((int)uVar10 < comp) {
        lVar7 = uVar8 * lVar3 + uVar10;
        fVar13 = data[lVar7] * 255.0 + 0.5;
        fVar1 = 0.0;
        if (0.0 <= fVar13) {
          fVar1 = fVar13;
        }
        fVar13 = 255.0;
        if (fVar1 <= 255.0) {
          fVar13 = fVar1;
        }
        psVar2[lVar7] = (stbi_uc)(int)fVar13;
      }
      pfVar11 = pfVar11 + lVar3;
      psVar12 = psVar12 + lVar3;
    }
    free(data);
  }
  return psVar2;
}

Assistant:

static stbi_uc *hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output = (stbi_uc *) malloc(x * y * comp);
   if (output == NULL) { free(data); return epuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*h2l_scale_i, h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = float2int(z);
      }
   }
   free(data);
   return output;
}